

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

gravity_map_t * gravity_map_deserialize(gravity_vm *vm,json_value *json)

{
  uint32_t n_00;
  json_value *entry;
  gravity_map_t *map_00;
  gravity_value_t key_00;
  gravity_value_t gVar1;
  gravity_object_t *obj;
  gravity_class_t *local_a8;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_a0;
  gravity_class_t *local_68;
  gravity_value_t value;
  gravity_value_t key;
  json_value *jsonv;
  char *label;
  uint32_t i;
  gravity_map_t *map;
  uint32_t n;
  json_value *json_local;
  gravity_vm *vm_local;
  
  n_00 = (json->u).string.length;
  map_00 = gravity_map_new(vm,n_00);
  for (label._4_4_ = 0; label._4_4_ < n_00; label._4_4_ = label._4_4_ + 1) {
    entry = (json->u).object.values[label._4_4_].value;
    key_00 = gravity_string_to_value
                       (vm,*(char **)((json->u).string.ptr + (ulong)label._4_4_ * 0x18),0xffffffff);
    switch(entry->type) {
    case json_object:
      value.isa = gravity_object_deserialize(vm,entry);
      if (value.isa == (gravity_object_t *)0x0) {
        local_68 = gravity_class_null;
        value.isa = (gravity_class_t *)0x0;
      }
      else {
        local_68 = (value.isa)->isa;
      }
      break;
    case json_array:
      return (gravity_map_t *)0x0;
    case json_integer:
      value.isa = (gravity_class_t *)(entry->u).integer;
      local_68 = gravity_class_int;
      break;
    case json_double:
      value.isa = (gravity_class_t *)(entry->u).integer;
      local_68 = gravity_class_float;
      break;
    case json_string:
      gVar1 = gravity_string_to_value(vm,(entry->u).string.ptr,(entry->u).string.length);
      local_a8 = gVar1.isa;
      local_68 = local_a8;
      local_a0 = gVar1.field_1;
      value.isa = local_a0.p;
      break;
    case json_boolean:
      value.isa = (gravity_class_t *)(long)(entry->u).boolean;
      local_68 = gravity_class_bool;
      break;
    case json_null:
      local_68 = gravity_class_null;
      value.isa = (gravity_class_t *)0x0;
      break;
    default:
      return (gravity_map_t *)0x0;
    }
    gVar1.field_1.p = value.isa;
    gVar1.isa = local_68;
    gravity_map_insert((gravity_vm *)0x0,map_00,key_00,gVar1);
  }
  return map_00;
}

Assistant:

static gravity_map_t *gravity_map_deserialize (gravity_vm *vm, json_value *json) {
    uint32_t n = json->u.object.length;
    gravity_map_t *map = gravity_map_new(vm, n);

    DEBUG_DESERIALIZE("DESERIALIZE MAP: %p\n", map);

    for (uint32_t i=0; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *jsonv = json->u.object.values[i].value;

        gravity_value_t key = VALUE_FROM_CSTRING(vm, label);
        gravity_value_t value;

        switch (jsonv->type) {
            case json_integer:
                value = VALUE_FROM_INT((gravity_int_t)jsonv->u.integer); break;
            case json_double:
                value = VALUE_FROM_FLOAT((gravity_float_t)jsonv->u.dbl); break;
            case json_boolean:
                value = VALUE_FROM_BOOL(jsonv->u.boolean); break;
            case json_string:
                value = VALUE_FROM_STRING(vm, jsonv->u.string.ptr, jsonv->u.string.length); break;
            case json_null:
                value = VALUE_FROM_NULL; break;
            case json_object: {
                gravity_object_t *obj = gravity_object_deserialize(vm, jsonv);
                value = (obj) ? VALUE_FROM_OBJECT(obj) : VALUE_FROM_NULL;
                break;
            }
            case json_array: {
                
            }
            default:
                goto abort_load;
        }

        gravity_map_insert(NULL, map, key, value);
    }
    return map;

abort_load:
    // do not free map here because it is already garbage collected
    return NULL;
}